

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O2

int __thiscall re2::Compiler::AddSuffixRecursive(Compiler *this,int root,int id)

{
  Inst *pIVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int hi;
  int foldcase;
  Frag FVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  
  if ((this->inst_[root].out_opcode_ & 5) != 0) {
    __assert_fail("inst_[root].opcode() == kInstAlt || inst_[root].opcode() == kInstByteRange",
                  "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/compile.cc",
                  0x215,"int re2::Compiler::AddSuffixRecursive(int, int)");
  }
  FVar5 = FindByteRange(this,root,id);
  uVar9 = (ulong)FVar5 & 0xffffffff;
  if (uVar9 == 0) {
    uVar8 = AllocInst(this,1);
    if (-1 < (int)uVar8) {
      Prog::Inst::InitAlt(this->inst_ + uVar8,root,id);
      return uVar8;
    }
  }
  else {
    uVar7 = (ulong)FVar5 >> 0x20;
    uVar8 = root;
    if (uVar7 != 0) {
      if ((uVar7 & 1) == 0) {
        uVar8 = this->inst_[uVar9].out_opcode_ >> 4;
      }
      else {
        uVar8 = Prog::Inst::out1(this->inst_ + uVar9);
      }
    }
    bVar2 = IsCachedRuneByteSuffix(this,uVar8);
    uVar6 = root;
    uVar3 = uVar8;
    if (bVar2) {
      uVar3 = AllocInst(this,1);
      if ((int)uVar3 < 0) {
        return 0;
      }
      pIVar1 = this->inst_;
      iVar4 = Prog::Inst::lo(pIVar1 + (int)uVar8);
      hi = Prog::Inst::hi(this->inst_ + (int)uVar8);
      foldcase = Prog::Inst::foldcase(this->inst_ + (int)uVar8);
      Prog::Inst::InitByteRange
                (pIVar1 + uVar3,iVar4,hi,foldcase,this->inst_[(int)uVar8].out_opcode_ >> 4);
      uVar6 = uVar3;
      if (uVar7 != 0) {
        pIVar1 = this->inst_;
        if ((uVar7 & 1) == 0) {
          pIVar1[uVar9].out_opcode_ = pIVar1[uVar9].out_opcode_ & 0xf | uVar3 << 4;
          uVar6 = root;
        }
        else {
          pIVar1[uVar9].field_1.cap_ = uVar3;
          uVar6 = root;
        }
      }
    }
    uVar8 = this->inst_[id].out_opcode_;
    bVar2 = IsCachedRuneByteSuffix(this,id);
    if (!bVar2) {
      if (this->inst_len_ + -1 != id) {
        __assert_fail("(id) == (inst_len_-1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/compile.cc"
                      ,0x23f,"int re2::Compiler::AddSuffixRecursive(int, int)");
      }
      pIVar1 = this->inst_;
      pIVar1[id].out_opcode_ = 0;
      pIVar1[id].field_1 = (anon_union_4_5_a3ff96c3_for_Inst_2)0x0;
      this->inst_len_ = this->inst_len_ + -1;
    }
    iVar4 = AddSuffixRecursive(this,this->inst_[(int)uVar3].out_opcode_ >> 4,uVar8 >> 4);
    if (iVar4 != 0) {
      this->inst_[(int)uVar3].out_opcode_ = this->inst_[(int)uVar3].out_opcode_ & 0xf | iVar4 << 4;
      return uVar6;
    }
  }
  return 0;
}

Assistant:

int Compiler::AddSuffixRecursive(int root, int id) {
  DCHECK(inst_[root].opcode() == kInstAlt ||
         inst_[root].opcode() == kInstByteRange);

  Frag f = FindByteRange(root, id);
  if (IsNoMatch(f)) {
    int alt = AllocInst(1);
    if (alt < 0)
      return 0;
    inst_[alt].InitAlt(root, id);
    return alt;
  }

  int br;
  if (f.end.p == 0)
    br = root;
  else if (f.end.p&1)
    br = inst_[f.begin].out1();
  else
    br = inst_[f.begin].out();

  if (IsCachedRuneByteSuffix(br)) {
    // We can't fiddle with cached suffixes, so make a clone of the head.
    int byterange = AllocInst(1);
    if (byterange < 0)
      return 0;
    inst_[byterange].InitByteRange(inst_[br].lo(), inst_[br].hi(),
                                   inst_[br].foldcase(), inst_[br].out());

    // Ensure that the parent points to the clone, not to the original.
    // Note that this could leave the head unreachable except via the cache.
    br = byterange;
    if (f.end.p == 0)
      root = br;
    else if (f.end.p&1)
      inst_[f.begin].out1_ = br;
    else
      inst_[f.begin].set_out(br);
  }

  int out = inst_[id].out();
  if (!IsCachedRuneByteSuffix(id)) {
    // The head should be the instruction most recently allocated, so free it
    // instead of leaving it unreachable.
    DCHECK_EQ(id, inst_len_-1);
    inst_[id].out_opcode_ = 0;
    inst_[id].out1_ = 0;
    inst_len_--;
  }

  out = AddSuffixRecursive(inst_[br].out(), out);
  if (out == 0)
    return 0;

  inst_[br].set_out(out);
  return root;
}